

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::
     ReadPackedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
               (CodedInputStream *input,RepeatedField<int> *values)

{
  bool bVar1;
  int iVar2;
  int32 local_2c;
  Limit local_28;
  int value;
  Limit limit;
  int length;
  RepeatedField<int> *values_local;
  CodedInputStream *input_local;
  
  _limit = values;
  values_local = (RepeatedField<int> *)input;
  bVar1 = io::CodedInputStream::ReadVarintSizeAsInt(input,&value);
  if (bVar1) {
    local_28 = io::CodedInputStream::PushLimit((CodedInputStream *)values_local,value);
    while (iVar2 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)values_local),
          0 < iVar2) {
      bVar1 = ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        ((CodedInputStream *)values_local,&local_2c);
      if (!bVar1) {
        return false;
      }
      RepeatedField<int>::Add(_limit,&local_2c);
    }
    io::CodedInputStream::PopLimit((CodedInputStream *)values_local,local_28);
    input_local._7_1_ = true;
  }
  else {
    input_local._7_1_ = false;
  }
  return input_local._7_1_;
}

Assistant:

inline bool WireFormatLite::ReadPackedPrimitive(io::CodedInputStream* input,
                                                RepeatedField<CType>* values) {
  int length;
  if (!input->ReadVarintSizeAsInt(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    CType value;
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->Add(value);
  }
  input->PopLimit(limit);
  return true;
}